

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMockerBase<unsigned_char_(unsigned_short)>::InvokeWith
          (FunctionMockerBase<unsigned_char_(unsigned_short)> *this,type args)

{
  uchar uVar1;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<unsigned_char> *pAVar2;
  scoped_ptr<testing::internal::ActionResultHolder<unsigned_char>_> local_28;
  scoped_ptr<testing::internal::ActionResultHolder<unsigned_char>_> holder;
  void *untyped_args;
  type args_local;
  FunctionMockerBase<unsigned_char_(unsigned_short)> *this_local;
  
  holder.ptr_ = (ActionResultHolder<unsigned_char> *)args;
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,args);
  pAVar2 = DownCast_<testing::internal::ActionResultHolder<unsigned_char>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  scoped_ptr<testing::internal::ActionResultHolder<unsigned_char>_>::scoped_ptr(&local_28,pAVar2);
  pAVar2 = scoped_ptr<testing::internal::ActionResultHolder<unsigned_char>_>::operator->(&local_28);
  uVar1 = ActionResultHolder<unsigned_char>::Unwrap(pAVar2);
  scoped_ptr<testing::internal::ActionResultHolder<unsigned_char>_>::~scoped_ptr(&local_28);
  return uVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    // const_cast is required since in C++98 we still pass ArgumentTuple around
    // by const& instead of rvalue reference.
    void* untyped_args = const_cast<void*>(static_cast<const void*>(&args));
    scoped_ptr<ResultHolder> holder(
        DownCast_<ResultHolder*>(this->UntypedInvokeWith(untyped_args)));
    return holder->Unwrap();
  }